

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O3

int main(int32 argc,char **argv)

{
  mdef_t *pmVar1;
  mgau_model_t *g;
  ms_mgau_model_t *msg;
  bool bVar2;
  kbcore_t *kbc;
  adapt_am_t *ad;
  cmn_type_t cmn;
  agc_type_t agc;
  int iVar3;
  cmd_ln_t *cmdln;
  long lVar4;
  char *pcVar5;
  logmath_t *plVar6;
  char *pcVar7;
  long lVar8;
  feat_t *pfVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double cipbeam;
  double dVar16;
  ptmr_t local_4070;
  char sent [16384];
  
  cmd_ln_appl_enter(argc,argv,"default.arg",defn);
  cmdln = cmd_ln_get();
  lVar4 = cmd_ln_int_r(cmdln,"-ctloffset");
  ctloffset = (int32)lVar4;
  sentfile = cmd_ln_str_r(cmdln,"-insent");
  sentfp = (FILE *)fopen(sentfile,"r");
  if ((FILE *)sentfp == (FILE *)0x0) {
    pcVar7 = "Failed to open file %s for reading";
    lVar4 = 0x3aa;
    pcVar5 = sentfile;
  }
  else {
    pcVar5 = cmd_ln_str_r(cmdln,"-s2stsegdir");
    if (pcVar5 != (char *)0x0) {
      pcVar5 = cmd_ln_str_r(cmdln,"-s2stsegdir");
      s2stsegdir = __ckd_salloc__(pcVar5,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                  ,0x3ae);
    }
    pcVar5 = cmd_ln_str_r(cmdln,"-stsegdir");
    if (pcVar5 != (char *)0x0) {
      pcVar5 = cmd_ln_str_r(cmdln,"-stsegdir");
      stsegdir = __ckd_salloc__(pcVar5,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                ,0x3b0);
    }
    pcVar5 = cmd_ln_str_r(cmdln,"-phsegdir");
    if (pcVar5 != (char *)0x0) {
      pcVar5 = cmd_ln_str_r(cmdln,"-phsegdir");
      phsegdir = __ckd_salloc__(pcVar5,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                ,0x3b2);
    }
    pcVar5 = cmd_ln_str_r(cmdln,"-phlabdir");
    if (pcVar5 != (char *)0x0) {
      pcVar5 = cmd_ln_str_r(cmdln,"-phlabdir");
      phlabdir = __ckd_salloc__(pcVar5,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                ,0x3b4);
    }
    pcVar5 = cmd_ln_str_r(cmdln,"-wdsegdir");
    if (pcVar5 != (char *)0x0) {
      pcVar5 = cmd_ln_str_r(cmdln,"-wdsegdir");
      wdsegdir = __ckd_salloc__(pcVar5,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                ,0x3b6);
    }
    if (0 < ctloffset) {
      do {
        pcVar5 = fgets(sent,0x4000,(FILE *)sentfp);
        if (pcVar5 == (char *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                  ,0x3c4,"EOF(%s)\n",sentfile);
          break;
        }
        iVar3 = ctloffset + -1;
        bVar2 = 1 < ctloffset;
        ctloffset = iVar3;
      } while (bVar2);
    }
    outsentfile = cmd_ln_str_r(cmdln,"-outsent");
    if ((outsentfile == (char *)0x0) ||
       (outsentfp = (FILE *)fopen(outsentfile,"w"), (FILE *)outsentfp != (FILE *)0x0)) {
      outctlfile = cmd_ln_str_r(cmdln,"-outctl");
      if ((outctlfile == (char *)0x0) ||
         (outctlfp = (FILE *)fopen(outctlfile,"w"), (FILE *)outctlfp != (FILE *)0x0)) {
        pcVar5 = cmd_ln_str_r(cmdln,"-s2stsegdir");
        if (((((pcVar5 == (char *)0x0) &&
              (pcVar5 = cmd_ln_str_r(cmdln,"-stsegdir"), pcVar5 == (char *)0x0)) &&
             (pcVar5 = cmd_ln_str_r(cmdln,"-phlabdir"), pcVar5 == (char *)0x0)) &&
            ((pcVar5 = cmd_ln_str_r(cmdln,"-phsegdir"), pcVar5 == (char *)0x0 &&
             (pcVar5 = cmd_ln_str_r(cmdln,"-wdsegdir"), pcVar5 == (char *)0x0)))) &&
           (pcVar5 = cmd_ln_str_r(cmdln,"-outsent"), pcVar5 == (char *)0x0)) {
          pcVar5 = "Missing output file/directory argument(s)\n";
          lVar4 = 0x3da;
        }
        else {
          ::kbc = New_kbcore(cmdln);
          dVar15 = cmd_ln_float_r(cmdln,"-logbase");
          lVar4 = cmd_ln_int_r(cmdln,"-log3table");
          plVar6 = logs3_init((float64)dVar15,1,(int32)lVar4);
          ::kbc->logmath = plVar6;
          pcVar5 = cmd_ln_str_r(cmdln,"-feat");
          pcVar7 = cmd_ln_str_r(cmdln,"-cmn");
          cmn = cmn_type_from_str(pcVar7);
          lVar4 = cmd_ln_int_r(cmdln,"-varnorm");
          pcVar7 = cmd_ln_str_r(cmdln,"-agc");
          agc = agc_type_from_str(pcVar7);
          lVar8 = cmd_ln_int_r(cmdln,"-ceplen");
          pfVar9 = feat_init(pcVar5,cmn,(uint)(lVar4 != 0),agc,1,(int32)lVar8);
          kbc = ::kbc;
          ::kbc->fcb = pfVar9;
          s3_am_init(kbc);
          iVar3 = cmd_ln_exists_r(cmdln,"-adcin");
          if (((iVar3 == 0) || (lVar4 = cmd_ln_int_r(cmdln,"-adcin"), lVar4 == 0)) ||
             (fe = fe_init_auto_r(cmdln), fe != (fe_t *)0x0)) {
            if (::kbc == (kbcore_t *)0x0) {
              __assert_fail("kbc",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                            ,0xdb,"void models_init(cmd_ln_t *)");
            }
            pmVar1 = ::kbc->mdef;
            if (pmVar1 == (mdef_t *)0x0) {
              __assert_fail("kbc->mdef",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                            ,0xdc,"void models_init(cmd_ln_t *)");
            }
            if (::kbc->tmat == (tmat_t *)0x0) {
              __assert_fail("kbc->tmat",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                            ,0xdd,"void models_init(cmd_ln_t *)");
            }
            pcVar5 = cmd_ln_str_r(cmdln,"-dict");
            pcVar7 = cmd_ln_str_r(cmdln,"-fdict");
            lVar4 = cmd_ln_int_r(cmdln,"-lts_mismatch");
            lVar8 = cmd_ln_int_r(cmdln,"-mdef_fillers");
            dict = dict_init(pmVar1,pcVar5,pcVar7,(int)lVar4,(uint)(lVar8 != 0),0,1);
            pmVar1 = ::kbc->mdef;
            uVar14 = 0xffffffffffffffff;
            do {
              lVar4 = uVar14 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar14 == (uint)(int)pmVar1->cd2cisen[lVar4]);
            ascr = ascr_init(pmVar1->n_sen,0,pmVar1->n_sseq,0,1,(int32)uVar14);
            lVar4 = cmd_ln_int_r(cmdln,"-ds");
            lVar8 = cmd_ln_int_r(cmdln,"-cond_ds");
            lVar10 = cmd_ln_int_r(cmdln,"-dist_ds");
            lVar11 = cmd_ln_int_r(cmdln,"-gs4gs");
            lVar12 = cmd_ln_int_r(cmdln,"-svq4svq");
            dVar15 = cmd_ln_float_r(cmdln,"-subvqbeam");
            cipbeam = cmd_ln_float_r(cmdln,"-ci_pbeam");
            dVar16 = cmd_ln_float_r(cmdln,"-tighten_factor");
            lVar13 = cmd_ln_int_r(cmdln,"-maxcdsenpf");
            fastgmm = fast_gmm_init((int32)lVar4,(int32)lVar8,(int32)lVar10,(int32)lVar11,
                                    (int32)lVar12,(float64)dVar15,(float64)cipbeam,
                                    (float32)(float)dVar16,(int32)lVar13,::kbc->mdef->n_ci_sen,
                                    ::kbc->logmath);
            adapt_am = adapt_am_init();
            if (feat == (float32 ***)0x0) {
              feat = feat_array_alloc(::kbc->fcb,15000);
            }
            timers[0].name = "U";
            timers[1].name = "G";
            timers[2].name = "S";
            timers[3].name = "A";
            align_init(::kbc->mdef,::kbc->tmat,dict,cmdln,::kbc->logmath);
            putchar(10);
            pcVar5 = cmd_ln_str_r(cmdln,"-mllr");
            ad = adapt_am;
            if (pcVar5 != (char *)0x0) {
              g = ::kbc->mgau;
              if (g == (mgau_model_t *)0x0) {
                msg = ::kbc->ms_mgau;
                if (msg == (ms_mgau_model_t *)0x0) {
                  err_msg(ERR_WARN,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                          ,0x3f3,"Can\'t use MLLR matrices with .s2semi. yet\n");
                }
                else {
                  pcVar5 = cmd_ln_str_r(cmdln,"-mllr");
                  model_set_mllr(msg,pcVar5,(char *)0x0,::kbc->fcb,::kbc->mdef,cmdln);
                }
              }
              else {
                pcVar5 = cmd_ln_str_r(cmdln,"-mllr");
                adapt_set_mllr(ad,g,pcVar5,(char *)0x0,::kbc->mdef,cmdln);
              }
            }
            tot_nfr = 0;
            pcVar5 = cmd_ln_str_r(cmdln,"-ctl");
            if (pcVar5 != (char *)0x0) {
              pcVar5 = cmd_ln_str_r(cmdln,"-ctl");
              pcVar7 = cmd_ln_str_r(cmdln,"-ctl_mllr");
              lVar4 = cmd_ln_int_r(cmdln,"-ctloffset");
              lVar8 = cmd_ln_int_r(cmdln,"-ctlcount");
              ctl_process(&local_4070,pcVar5,(char *)0x0,pcVar7,(int32)lVar4,(int32)lVar8,utt_align,
                          cmdln);
              if (0 < tot_nfr) {
                putchar(10);
                printf("TOTAL FRAMES:       %8d\n",(ulong)(uint)tot_nfr);
                printf("TOTAL CPU TIME:     %11.2f sec, %7.2f xRT\n",tm_utt.t_tot_cpu,
                       (double)tm_utt.t_tot_cpu / ((double)tot_nfr * 0.01));
                printf("TOTAL ELAPSED TIME: %11.2f sec, %7.2f xRT\n",tm_utt.t_tot_elapsed,
                       (double)tm_utt.t_tot_elapsed / ((double)tot_nfr * 0.01));
              }
              if (outsentfp != (FILE *)0x0) {
                fclose((FILE *)outsentfp);
              }
              if (outctlfp != (FILE *)0x0) {
                fclose((FILE *)outctlfp);
              }
              if (sentfp != (FILE *)0x0) {
                fclose((FILE *)sentfp);
              }
              ckd_free(s2stsegdir);
              ckd_free(stsegdir);
              ckd_free(phsegdir);
              ckd_free(wdsegdir);
              feat_array_free(feat);
              align_free();
              if (adapt_am != (adapt_am_t *)0x0) {
                adapt_am_free(adapt_am);
              }
              if (fastgmm != (fast_gmm_t *)0x0) {
                fast_gmm_free(fastgmm);
              }
              if (ascr != (ascr_t *)0x0) {
                ascr_free(ascr);
              }
              if (dict != (dict_t *)0x0) {
                dict_free(dict);
              }
              kbcore_free(::kbc);
              cmd_ln_free_r(cmdln);
              return 0;
            }
            pcVar5 = " -ctl are not specified.\n";
            lVar4 = 0x405;
          }
          else {
            pcVar5 = "fe_init_auto_r() failed\n";
            lVar4 = 0xd7;
          }
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                ,lVar4,pcVar5);
        goto LAB_0011304a;
      }
      pcVar7 = "Failed top open file %s for writing";
      lVar4 = 0x3d1;
      pcVar5 = outctlfile;
    }
    else {
      pcVar7 = "Failed to open file %s for writing";
      lVar4 = 0x3cc;
      pcVar5 = outsentfile;
    }
  }
  err_msg_system(ERR_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                 ,lVar4,pcVar7,pcVar5);
LAB_0011304a:
  exit(1);
}

Assistant:

int
main(int32 argc, char *argv[])
{
    char sent[16384];
    cmd_ln_t *config;

    cmd_ln_appl_enter(argc, argv, "default.arg", defn);

    config = cmd_ln_get();

    ctloffset = cmd_ln_int32_r(config, "-ctloffset");
    sentfile = cmd_ln_str_r(config, "-insent");

    if ((sentfp = fopen(sentfile, "r")) == NULL)
        E_FATAL_SYSTEM("Failed to open file %s for reading", sentfile);

    /* Note various output directories */
    if (cmd_ln_str_r(config, "-s2stsegdir") != NULL)
        s2stsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-s2stsegdir"));
    if (cmd_ln_str_r(config, "-stsegdir") != NULL)
        stsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-stsegdir"));
    if (cmd_ln_str_r(config, "-phsegdir") != NULL)
        phsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-phsegdir"));
    if (cmd_ln_str_r(config, "-phlabdir") != NULL)
        phlabdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-phlabdir"));
    if (cmd_ln_str_r(config, "-wdsegdir") != NULL)
        wdsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-wdsegdir"));

    /* HACK! Pre-read insent without checking whether ctl could also 
       be read.  In general, this is caused by the fact that we used
       multiple files to specify resource in sphinx III.  This is easy
       to solve but currently I just to remove process_ctl because it
       duplicates badly with ctl_process.  

       The call back function will take care of matching the uttfile
       names. We don't need to worry too much about inconsistency. 
     */

    while (ctloffset > 0) {
        if (fgets(sent, sizeof(sent), sentfp) == NULL) {
            E_ERROR("EOF(%s)\n", sentfile);
            break;
        }
        --ctloffset;
    }

    if ((outsentfile = cmd_ln_str_r(config, "-outsent")) != NULL) {
        if ((outsentfp = fopen(outsentfile, "w")) == NULL)
            E_FATAL_SYSTEM("Failed to open file %s for writing", outsentfile);
    }

    if ((outctlfile = cmd_ln_str_r(config, "-outctl")) != NULL) {
        if ((outctlfp = fopen(outctlfile, "w")) == NULL)
            E_FATAL_SYSTEM("Failed top open file %s for writing", outctlfile);
    }

    if ((cmd_ln_str_r(config, "-s2stsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-stsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-phlabdir") == NULL) &&
        (cmd_ln_str_r(config, "-phsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-wdsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-outsent") == NULL))
        E_FATAL("Missing output file/directory argument(s)\n");

    /* Read in input databases */
    models_init(config);

    if (!feat)
        feat = feat_array_alloc(kbcore_fcb(kbc), S3_MAX_FRAMES);

    timers[tmr_utt].name = "U";
    timers[tmr_gauden].name = "G";
    timers[tmr_senone].name = "S";
    timers[tmr_align].name = "A";

    /* Initialize align module */
    align_init(kbc->mdef, kbc->tmat, dict, config, kbc->logmath);
    printf("\n");

    if (cmd_ln_str_r(config, "-mllr") != NULL) {
        if (kbc->mgau)
            adapt_set_mllr(adapt_am, kbc->mgau, cmd_ln_str_r(config, "-mllr"), NULL,
                           kbc->mdef, config);
        else if (kbc->ms_mgau)
            model_set_mllr(kbc->ms_mgau, cmd_ln_str_r(config, "-mllr"), NULL, kbcore_fcb(kbc),
                           kbc->mdef, config);
        else
            E_WARN("Can't use MLLR matrices with .s2semi. yet\n");
    }

    tot_nfr = 0;

    /*  process_ctlfile (); */

    if (cmd_ln_str_r(config, "-ctl")) {
        /* When -ctlfile is speicified, corpus.c will look at -ctl_mllr to get
           the corresponding  MLLR for the utterance */
        ctl_process(cmd_ln_str_r(config, "-ctl"),
                    NULL,
                    cmd_ln_str_r(config, "-ctl_mllr"),
                    cmd_ln_int32_r(config, "-ctloffset"),
                    cmd_ln_int32_r(config, "-ctlcount"),
                    utt_align, config);
    }
    else {
        E_FATAL(" -ctl are not specified.\n");
    }

    if (tot_nfr > 0) {
        printf("\n");
        printf("TOTAL FRAMES:       %8d\n", tot_nfr);
        printf("TOTAL CPU TIME:     %11.2f sec, %7.2f xRT\n",
               tm_utt.t_tot_cpu, tm_utt.t_tot_cpu / (tot_nfr * 0.01));
        printf("TOTAL ELAPSED TIME: %11.2f sec, %7.2f xRT\n",
               tm_utt.t_tot_elapsed,
               tm_utt.t_tot_elapsed / (tot_nfr * 0.01));
    }

    if (outsentfp)
        fclose(outsentfp);
    if (outctlfp)
        fclose(outctlfp);
    if (sentfp)
        fclose(sentfp);

    ckd_free(s2stsegdir);
    ckd_free(stsegdir);
    ckd_free(phsegdir);
    ckd_free(wdsegdir);

    feat_array_free(feat);
    align_free();
    models_free();

    cmd_ln_free_r(config);
    return 0;
}